

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void do_paint(Terminal *term)

{
  _Bool _Var1;
  unsigned_long bchr;
  termline *destline;
  bool bVar2;
  wchar_t wVar3;
  bool bVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint uVar8;
  wchar_t *ch;
  void *ptr;
  termline *ptVar9;
  termchar *ptVar10;
  ulong uVar11;
  termchar *ptVar12;
  byte bVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  long lVar16;
  wchar_t wVar17;
  uint uVar18;
  long lVar19;
  wchar_t *pwVar20;
  unsigned_long *puVar21;
  byte bVar22;
  unsigned_long *puVar23;
  ulong uVar24;
  wchar_t wVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  truecolour tVar34;
  byte local_10d;
  byte local_10c;
  byte local_10b;
  _Bool local_10a;
  wchar_t local_e4;
  ulong local_c8;
  termchar *local_90;
  size_t chlen;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  chlen = 0x400;
  ch = (wchar_t *)safemalloc(0x400,4,0);
  ptr = safemalloc((long)term->cols,0x20,0);
  wVar3 = L'\0';
  if (term->cursor_on == true) {
    wVar6 = L'\x20000000';
    if ((term->has_focus == true) && (wVar6 = L'\x40000000', term->cblinker == false)) {
      wVar6 = (term->blink_cur ^ 1) << 0x1e;
    }
    wVar3 = wVar6 | 0x10000000;
    if (term->wrapnext == false) {
      wVar3 = wVar6;
    }
  }
  _Var5 = term->rvideo;
  _Var1 = term->in_vbell;
  wVar6 = (term->curs).y;
  uVar28 = (long)wVar6 - (long)term->disptop;
  ptVar9 = lineptr(term,wVar6,L'ᝀ',L'\0');
  wVar6 = (term->curs).x;
  ptVar10 = term_bidi_line(term,ptVar9,(wchar_t)uVar28);
  if (ptVar10 == (termchar *)0x0) {
    ptVar10 = ptVar9->chars;
  }
  else {
    wVar6 = term->post_bidi_cache[uVar28].forward[wVar6];
  }
  if (L'\0' < wVar6) {
    wVar6 = wVar6 - (uint)(ptVar10[(uint)wVar6].chr == 0xdfff);
  }
  unlineptr(ptVar9);
  wVar17 = term->dispcursy;
  if ((-1 < (long)wVar17) &&
     (((wVar25 = term->dispcursx, term->curstype != wVar3 || (wVar17 != (wchar_t)uVar28)) ||
      (wVar25 != wVar6)))) {
    ptVar10 = term->disptext[wVar17]->chars + wVar25;
    if ((L'\0' < wVar25) && (ptVar10->chr == 0xdfff)) {
      *(uint *)&ptVar10[-1].attr = (uint)ptVar10[-1].attr | 0x3ffff;
    }
    if ((wVar25 < term->cols + L'\xffffffff') && (ptVar10[1].chr == 0xdfff)) {
      *(uint *)&ptVar10[1].attr = (uint)ptVar10[1].attr | 0x3ffff;
    }
    *(uint *)&ptVar10->attr = (uint)ptVar10->attr | 0x3ffff;
    term->curstype = L'\0';
  }
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  local_40 = (ulong)(_Var5 != _Var1) << 0x14;
  local_58 = (ulong)(uint)wVar3;
  local_48 = (ulong)(uint)wVar6 << 2;
  uVar27 = 0;
  local_50 = uVar28;
  do {
    if ((long)term->rows <= (long)uVar27) {
      safefree(ptr);
      safefree(ch);
      return;
    }
    wVar25 = (wchar_t)uVar27;
    wVar17 = term->disptop + wVar25;
    ptVar9 = lineptr(term,wVar17,L'᝶',L'\0');
    local_90 = term_bidi_line(term,ptVar9,wVar25);
    if (local_90 == (termchar *)0x0) {
      local_90 = ptVar9->chars;
      pwVar20 = (wchar_t *)0x0;
    }
    else {
      pwVar20 = term->post_bidi_cache[uVar27].backward;
    }
    lVar29 = 0;
    lVar16 = 0;
    while( true ) {
      wVar7 = term->cols;
      if (wVar7 <= lVar16) break;
      if (pwVar20 == (wchar_t *)0x0) {
        wVar15 = (wchar_t)lVar16;
      }
      else {
        wVar15 = *(wchar_t *)((long)pwVar20 + lVar29);
      }
      uVar11 = (ulong)((uint)(&local_90->attr)[lVar29] & 0xfffc0000) | 0x20500;
      if (term->ansi_colour != false) {
        uVar11 = (&local_90->attr)[lVar29];
      }
      if (term->xterm_256_colour == false) {
        uVar31 = (ulong)((uint)uVar11 & 0xfffffe00) | 0x100;
        if (0xef < ((uint)uVar11 & 0x1f0) - 0x10) {
          uVar31 = uVar11;
        }
        uVar11 = (ulong)((uint)uVar31 & 0xfffc01ff) | 0x20400;
        if (0xef < ((uint)(uVar31 >> 9) & 0x1f0) - 0x10) {
          uVar11 = uVar31;
        }
      }
      tVar34.fg.enabled = false;
      tVar34.fg.r = '\0';
      tVar34.fg.g = '\0';
      tVar34.fg.b = '\0';
      tVar34.bg.enabled = false;
      tVar34.bg.r = '\0';
      tVar34.bg.g = '\0';
      tVar34.bg.b = '\0';
      if (term->true_colour == true) {
        tVar34 = (&local_90->truecolour)[lVar29];
      }
      uVar31 = (&local_90->chr)[lVar29];
      uVar18 = (uint)uVar31 & 0xffffff00;
      if (uVar18 == 0xd800) {
        lVar19 = 0x40c;
LAB_00106f39:
        uVar31 = (ulong)*(int *)((long)term->ucsdata->unitab_scoacs +
                                (uVar31 & 0xff) * 4 + lVar19 + -0xc);
      }
      else {
        if (uVar18 == 0xda00) {
          lVar19 = 0xc;
          goto LAB_00106f39;
        }
        if (uVar18 == 0xd900) {
          lVar19 = 0xc0c;
          goto LAB_00106f39;
        }
      }
      if ((lVar16 < (long)wVar7 + -1) && ((&local_90[1].chr)[lVar29] == 0xdfff)) {
        uVar11 = uVar11 | 0x400000;
      }
      if ((term->selstate & ~ABOUT_TO) == DRAGGING) {
        wVar7 = (term->selstart).y;
        wVar14 = (term->selstart).x;
        if (term->seltype == LEXICOGRAPHIC) {
          bVar2 = wVar14 <= wVar15;
          if (wVar17 != wVar7) {
            bVar2 = wVar7 < wVar17;
          }
          if (bVar2) {
            wVar7 = (term->selend).y;
            bVar2 = wVar15 < (term->selend).x;
            if (wVar17 != wVar7) {
              bVar2 = wVar17 < wVar7;
            }
            if (bVar2) {
LAB_00107005:
              uVar26 = 0x100000;
              goto LAB_00107010;
            }
          }
          goto LAB_0010700d;
        }
        if (wVar17 < wVar7) goto LAB_0010700d;
        uVar26 = 0;
        if (wVar14 <= wVar15) {
          if (wVar15 < (term->selend).x && wVar17 <= (term->selend).y) goto LAB_00107005;
          goto LAB_0010700d;
        }
      }
      else {
LAB_0010700d:
        uVar26 = 0;
      }
LAB_00107010:
      uVar26 = uVar26 ^ local_40 ^ uVar11;
      if ((term->blink_is_real == true) && ((uVar11 & 0x200000) != 0)) {
        if ((term->has_focus == true) && (term->tblinker == true)) {
          uVar31 = (ulong)term->ucsdata->unitab_line[0x20];
        }
        uVar26 = (ulong)((uint)uVar26 & 0xffdfffff);
      }
      ptVar10 = term->disptext[uVar27]->chars;
      if ((uVar31 == (&ptVar10->chr)[lVar29]) &&
         (uVar11 = (&ptVar10->attr)[lVar29], uVar26 == (uVar11 & 0xffffffff0f7fffff))) {
        uVar26 = uVar26 | (uint)uVar11 & 0x800000;
      }
      else if (((uint)uVar26 >> 0x16 & 1) == 0) {
        wVar7 = (*term->win->vt->char_width)(term->win,(wchar_t)uVar31);
        if (wVar7 == L'\x02') {
          uVar26 = uVar26 | 0x800000;
        }
      }
      if ((uVar27 == (uVar28 & 0xffffffff)) && (local_48 == lVar29)) {
        uVar26 = uVar26 | local_58;
        term->curstype = wVar3;
        term->dispcursx = wVar6;
        term->dispcursy = (wchar_t)local_50;
      }
      *(ulong *)((long)ptr + lVar29 * 8 + 8) = uVar26;
      *(ulong *)((long)ptr + lVar29 * 8) = uVar31;
      *(truecolour *)((long)ptr + lVar29 * 8 + 0x10) = tVar34;
      *(undefined4 *)((long)ptr + lVar29 * 8 + 0x18) = 0;
      lVar16 = lVar16 + 1;
      lVar29 = lVar29 + 4;
    }
    uVar11 = 0;
    uVar31 = 0;
    if (L'\0' < wVar7) {
      uVar31 = (ulong)(uint)wVar7;
    }
    uVar26 = 0;
    bVar2 = false;
    for (; uVar11 != uVar31; uVar11 = uVar11 + 1) {
      ptVar12 = term->disptext[uVar27]->chars;
      ptVar10 = ptVar12 + uVar11;
      puVar21 = &ptVar10->attr;
      uVar24 = *puVar21;
      if ((int)uVar24 < 0) {
        uVar26 = uVar11 & 0xffffffff;
        bVar2 = false;
      }
      if ((ptVar10->chr == *(unsigned_long *)((long)ptr + uVar11 * 0x20)) &&
         ((uVar24 & 0xffffffff0fffffff) == *(ulong *)((long)ptr + uVar11 * 0x20 + 8))) {
        if (bVar2) goto LAB_001071e2;
      }
      else {
        if (!bVar2) {
          lVar16 = (long)(int)uVar26;
          puVar23 = &ptVar12[lVar16].attr;
          for (; lVar16 < (long)uVar11; lVar16 = lVar16 + 1) {
            *(uint *)puVar23 = (uint)*puVar23 | 0x3ffff;
            puVar23 = puVar23 + 4;
          }
          uVar24 = *puVar21;
          bVar2 = true;
        }
LAB_001071e2:
        *puVar21 = uVar24 | 0x3ffff;
      }
    }
    bVar32 = ptVar9->lattr != term->disptext[uVar27]->lattr;
    term->disptext[uVar27]->lattr = ptVar9->lattr;
    local_10a = (term->erase_char).truecolour.fg.enabled;
    local_10b = (term->erase_char).truecolour.bg.r;
    local_68 = ZEXT416(*(uint *)&(term->erase_char).truecolour.fg.r);
    local_10c = (term->erase_char).truecolour.bg.g;
    local_10d = (term->erase_char).truecolour.bg.b;
    local_c8 = 0;
    uVar18 = 0;
    local_e4 = L'\0';
    uVar11 = 0;
    bVar2 = false;
    wVar17 = L'\0';
    bVar4 = bVar32;
    while( true ) {
      uVar8 = local_68._0_4_;
      uVar31 = (ulong)local_10a;
      wVar15 = (wchar_t)uVar11;
      if (wVar7 <= wVar17) break;
      lVar16 = (long)wVar17;
      lVar29 = lVar16 * 0x20;
      uVar26 = *(ulong *)((long)ptr + lVar29 + 8);
      ptVar10 = term->disptext[uVar27]->chars;
      if ((((uint)ptVar10[lVar16].attr ^ (uint)uVar26) >> 0x16 & 1) != 0) {
        bVar4 = true;
      }
      bVar33 = ((uVar26 ^ local_c8) & (long)term->attr_mask) != 0;
      bVar13 = *(byte *)((long)ptr + lVar29 + 0x10);
      if ((((((bVar13 != (local_10a & 1U)) || (*(uchar *)((long)ptr + lVar29 + 0x11) != local_68[0])
             ) || (*(uchar *)((long)ptr + lVar29 + 0x12) != local_68[1])) ||
           ((*(uchar *)((long)ptr + lVar29 + 0x13) != local_68[2] ||
            ((bool)*(char *)((long)ptr + lVar29 + 0x14) != ((uVar8 >> 0x18 & 1) != 0))))) ||
          (*(byte *)((long)ptr + lVar29 + 0x15) != local_10b)) ||
         ((*(byte *)((long)ptr + lVar29 + 0x16) != local_10c ||
          (*(byte *)((long)ptr + lVar29 + 0x17) != local_10d)))) {
        bVar33 = true;
      }
      bchr = *(unsigned_long *)((long)ptr + lVar29);
      wVar7 = (wchar_t)bchr;
      uVar30 = 0;
      if ((wVar7 & 0xfffffe00U) == 0xdc00) {
        uVar30 = wVar7 & 0xffffff00U;
      }
      ptVar12 = local_90 + lVar16;
      if ((wVar7 & 0xfffffc00U) == 0xd800) {
        uVar30 = wVar7 & 0xffffff00U;
      }
      if ((ptVar12->cc_next != L'\0') ||
         ((bVar33 = (bool)(uVar30 != uVar18 | bVar33), L'\0' < wVar17 &&
          (ptVar12[-1].cc_next != L'\0')))) {
        bVar33 = true;
      }
      if ((ptVar12->chr == 0xdffe) ||
         (((L'\x01' < wVar17 && (ptVar12[-1].chr == 0xdfff)) && (ptVar12[-2].chr == 0xdffe)))) {
        bVar33 = true;
      }
      bVar22 = term->ucsdata->dbcs_screenfont;
      local_38 = uVar31;
      if (((_Bool)bVar22 != false) || (bVar4)) {
        if (bVar33) goto LAB_00107509;
      }
      else if (((((((ptVar10[lVar16].chr == bchr) &&
                   ((ptVar10[lVar16].attr & 0xffffffff0fffffff) == uVar26)) &&
                  ((ptVar10[lVar16].truecolour.fg.enabled == (_Bool)(local_10a & 1U) &&
                   (((ptVar10[lVar16].truecolour.fg.r == local_68[0] &&
                     (ptVar10[lVar16].truecolour.fg.g == local_68[1])) &&
                    (ptVar10[lVar16].truecolour.fg.b == local_68[2])))))) &&
                 ((ptVar10[lVar16].truecolour.bg.enabled == ((uVar8 >> 0x18 & 1) != 0) &&
                  (ptVar10[lVar16].truecolour.bg.r == local_10b)))) &&
                (ptVar10[lVar16].truecolour.bg.g == local_10c)) &&
               (ptVar10[lVar16].truecolour.bg.b == local_10d)) ||
              ((bool)(~bVar32 & wVar15 == L'\x01') || bVar33)) {
LAB_00107509:
        if (((bVar32) || (bVar2)) && (L'\0' < wVar15)) {
          do_paint_draw(term,ptVar9,local_e4,wVar25,ch,wVar15,local_c8,
                        (truecolour)
                        ((ulong)(uVar8 >> 0x18 |
                                (uint)local_10b << 8 |
                                (uint)local_10c << 0x10 | (uint)local_10d << 0x18) << 0x20 |
                        uVar31 | uVar8 << 8));
          bVar13 = *(byte *)((long)ptr + lVar29 + 0x10);
          bVar22 = term->ucsdata->dbcs_screenfont;
          ptVar10 = term->disptext[uVar27]->chars;
        }
        local_68 = ZEXT416(*(uint *)((long)ptr + lVar29 + 0x11));
        local_10b = *(byte *)((long)ptr + lVar29 + 0x15);
        local_10c = *(byte *)((long)ptr + lVar29 + 0x16);
        local_10d = *(byte *)((long)ptr + lVar29 + 0x17);
        if ((bVar22 & 1) != 0) {
          bVar2 = bVar32;
        }
        wVar15 = L'\0';
        local_10a = (_Bool)bVar13;
        local_e4 = wVar17;
        local_c8 = uVar26;
        bVar32 = bVar4;
        uVar18 = uVar30;
      }
      _Var5 = termchars_equal_override(ptVar10 + lVar16,ptVar12,bchr,uVar26);
      if (!_Var5) {
        bVar32 = true;
      }
      ch = (wchar_t *)safegrowarray(ch,&chlen,4,(long)wVar15,2,false);
      uVar11 = (ulong)(uint)(wVar15 + L'\x01');
      ch[wVar15] = wVar7;
      wVar7 = ptVar12->cc_next;
      if (wVar7 != L'\0') {
        uVar11 = (ulong)(wVar15 + L'\x01');
        ptVar10 = ptVar12;
        while (wVar7 != L'\0') {
          wVar15 = (wchar_t)ptVar10[wVar7].chr;
          uVar8 = wVar15 & 0xffffff00;
          if (uVar8 == 0xd800) {
            lVar29 = 0x40c;
LAB_001076d7:
            wVar15 = *(wchar_t *)
                      ((long)term->ucsdata->unitab_scoacs +
                      (ptVar10[wVar7].chr & 0xff) * 4 + lVar29 + -0xc);
          }
          else {
            if (uVar8 == 0xda00) {
              lVar29 = 0xc;
              goto LAB_001076d7;
            }
            if (uVar8 == 0xd900) {
              lVar29 = 0xc0c;
              goto LAB_001076d7;
            }
          }
          ptVar10 = ptVar10 + wVar7;
          ch = (wchar_t *)safegrowarray(ch,&chlen,4,uVar11,2,false);
          ch[uVar11] = wVar15;
          uVar11 = uVar11 + 1;
          wVar7 = ptVar10->cc_next;
        }
        local_c8 = local_c8 | 0x80000000;
      }
      if (!_Var5) {
        copy_termchar(term->disptext[uVar27],wVar17,ptVar12);
        ptVar10 = term->disptext[uVar27]->chars;
        ptVar10[lVar16].chr = bchr;
        ptVar10[lVar16].attr = uVar26;
        ptVar10[lVar16].truecolour.fg.enabled = local_10a;
        *(undefined4 *)&ptVar10[lVar16].truecolour.fg.r = local_68._0_4_;
        ptVar10[lVar16].truecolour.bg.r = local_10b;
        ptVar10[lVar16].truecolour.bg.g = local_10c;
        ptVar10[lVar16].truecolour.bg.b = local_10d;
        if (local_e4 == wVar17) {
          puVar21 = &term->disptext[uVar27]->chars[lVar16].attr;
          *puVar21 = *puVar21 | 0x80000000;
        }
      }
      wVar7 = term->cols;
      if ((((uint)uVar26 >> 0x16 & 1) != 0) && (wVar17 = wVar17 + L'\x01', wVar17 < wVar7)) {
        if ((uVar27 == (uVar28 & 0xffffffff)) && (wVar17 == wVar6)) {
          __assert_fail("!(i == our_curs_y && j == our_curs_x)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x189a,"void do_paint(Terminal *)");
        }
        destline = term->disptext[uVar27];
        _Var5 = termchars_equal(destline->chars + wVar17,ptVar12 + 1);
        if (!_Var5) {
          bVar32 = true;
        }
        copy_termchar(destline,wVar17,ptVar12 + 1);
        wVar7 = term->cols;
      }
      wVar17 = wVar17 + L'\x01';
    }
    if ((bVar32) && (L'\0' < wVar15)) {
      do_paint_draw(term,ptVar9,local_e4,wVar25,ch,wVar15,local_c8,
                    (truecolour)
                    ((ulong)(uVar8 >> 0x18 |
                            (uint)local_10b << 8 | (uint)local_10c << 0x10 | (uint)local_10d << 0x18
                            ) << 0x20 | uVar31 | uVar8 << 8));
    }
    unlineptr(ptVar9);
    uVar27 = uVar27 + 1;
  } while( true );
}

Assistant:

static void do_paint(Terminal *term)
{
    int i, j, our_curs_y, our_curs_x;
    int rv, cursor;
    pos scrpos;
    wchar_t *ch;
    size_t chlen;
    termchar *newline;

    chlen = 1024;
    ch = snewn(chlen, wchar_t);

    newline = snewn(term->cols, termchar);

    rv = (!term->rvideo ^ !term->in_vbell ? ATTR_REVERSE : 0);

    /* Depends on:
     * screen array, disptop, scrtop,
     * selection, rv,
     * blinkpc, blink_is_real, tblinker,
     * curs.y, curs.x, cblinker, blink_cur, cursor_on, has_focus, wrapnext
     */

    /* Has the cursor position or type changed ? */
    if (term->cursor_on) {
        if (term->has_focus) {
            if (term->cblinker || !term->blink_cur)
                cursor = TATTR_ACTCURS;
            else
                cursor = 0;
        } else
            cursor = TATTR_PASCURS;
        if (term->wrapnext)
            cursor |= TATTR_RIGHTCURS;
    } else
        cursor = 0;
    our_curs_y = term->curs.y - term->disptop;
    {
        /*
         * Adjust the cursor position:
         *  - for bidi
         *  - in the case where it's resting on the right-hand half
         *    of a CJK wide character. xterm's behaviour here,
         *    which seems adequate to me, is to display the cursor
         *    covering the _whole_ character, exactly as if it were
         *    one space to the left.
         */
        termline *ldata = lineptr(term->curs.y);
        termchar *lchars;

        our_curs_x = term->curs.x;

        if ( (lchars = term_bidi_line(term, ldata, our_curs_y)) != NULL) {
            our_curs_x = term->post_bidi_cache[our_curs_y].forward[our_curs_x];
        } else
            lchars = ldata->chars;

        if (our_curs_x > 0 &&
            lchars[our_curs_x].chr == UCSWIDE)
            our_curs_x--;

        unlineptr(ldata);
    }

    /*
     * If the cursor is not where it was last time we painted, and
     * its previous position is visible on screen, invalidate its
     * previous position.
     */
    if (term->dispcursy >= 0 &&
        (term->curstype != cursor ||
         term->dispcursy != our_curs_y ||
         term->dispcursx != our_curs_x)) {
        termchar *dispcurs = term->disptext[term->dispcursy]->chars +
            term->dispcursx;

        if (term->dispcursx > 0 && dispcurs->chr == UCSWIDE)
            dispcurs[-1].attr |= ATTR_INVALID;
        if (term->dispcursx < term->cols-1 && dispcurs[1].chr == UCSWIDE)
            dispcurs[1].attr |= ATTR_INVALID;
        dispcurs->attr |= ATTR_INVALID;

        term->curstype = 0;
    }
    term->dispcursx = term->dispcursy = -1;

    /* The normal screen data */
    for (i = 0; i < term->rows; i++) {
        termline *ldata;
        termchar *lchars;
        bool dirty_line, dirty_run, selected;
        unsigned long attr = 0, cset = 0;
        int start = 0;
        int ccount = 0;
        bool last_run_dirty = false;
        int laststart;
        bool dirtyrect;
        int *backward;
        truecolour tc;

        scrpos.y = i + term->disptop;
        ldata = lineptr(scrpos.y);

        /* Do Arabic shaping and bidi. */
        lchars = term_bidi_line(term, ldata, i);
        if (lchars) {
            backward = term->post_bidi_cache[i].backward;
        } else {
            lchars = ldata->chars;
            backward = NULL;
        }

        /*
         * First loop: work along the line deciding what we want
         * each character cell to look like.
         */
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            termchar *d = lchars + j;
            scrpos.x = backward ? backward[j] : j;

            tchar = d->chr;
            tattr = d->attr;

            if (!term->ansi_colour)
                tattr = (tattr & ~(ATTR_FGMASK | ATTR_BGMASK)) |
                ATTR_DEFFG | ATTR_DEFBG;

            if (!term->xterm_256_colour) {
                int colour;
                colour = (tattr & ATTR_FGMASK) >> ATTR_FGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_FGMASK) | ATTR_DEFFG;
                colour = (tattr & ATTR_BGMASK) >> ATTR_BGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_BGMASK) | ATTR_DEFBG;
            }

            if (term->true_colour) {
                tc = d->truecolour;
            } else {
                tc.fg = tc.bg = optionalrgb_none;
            }

            switch (tchar & CSET_MASK) {
              case CSET_ASCII:
                tchar = term->ucsdata->unitab_line[tchar & 0xFF];
                break;
              case CSET_LINEDRW:
                tchar = term->ucsdata->unitab_xterm[tchar & 0xFF];
                break;
              case CSET_SCOACS:
                tchar = term->ucsdata->unitab_scoacs[tchar&0xFF];
                break;
            }
            if (j < term->cols-1 && d[1].chr == UCSWIDE)
                tattr |= ATTR_WIDE;

            /* Video reversing things */
            if (term->selstate == DRAGGING || term->selstate == SELECTED) {
                if (term->seltype == LEXICOGRAPHIC)
                    selected = (posle(term->selstart, scrpos) &&
                                poslt(scrpos, term->selend));
                else
                    selected = (posPle(term->selstart, scrpos) &&
                                posPle_left(scrpos, term->selend));
            } else
                selected = false;
            tattr = (tattr ^ rv
                     ^ (selected ? ATTR_REVERSE : 0));

            /* 'Real' blinking ? */
            if (term->blink_is_real && (tattr & ATTR_BLINK)) {
                if (term->has_focus && term->tblinker) {
                    tchar = term->ucsdata->unitab_line[(unsigned char)' '];
                }
                tattr &= ~ATTR_BLINK;
            }

            /*
             * Check the font we'll _probably_ be using to see if
             * the character is wide when we don't want it to be.
             */
            if (tchar != term->disptext[i]->chars[j].chr ||
                tattr != (term->disptext[i]->chars[j].attr &~
                          (ATTR_NARROW | DATTR_MASK))) {
                if ((tattr & ATTR_WIDE) == 0 &&
                    win_char_width(term->win, tchar) == 2)
                    tattr |= ATTR_NARROW;
            } else if (term->disptext[i]->chars[j].attr & ATTR_NARROW)
                tattr |= ATTR_NARROW;

            if (i == our_curs_y && j == our_curs_x) {
                tattr |= cursor;
                term->curstype = cursor;
                term->dispcursx = j;
                term->dispcursy = i;
            }

            /* FULL-TERMCHAR */
            newline[j].attr = tattr;
            newline[j].chr = tchar;
            newline[j].truecolour = tc;
            /* Combining characters are still read from lchars */
            newline[j].cc_next = 0;
        }

        /*
         * Now loop over the line again, noting where things have
         * changed.
         *
         * During this loop, we keep track of where we last saw
         * DATTR_STARTRUN. Any mismatch automatically invalidates
         * _all_ of the containing run that was last printed: that
         * is, any rectangle that was drawn in one go in the
         * previous update should be either left completely alone
         * or overwritten in its entirety. This, along with the
         * expectation that front ends clip all text runs to their
         * bounding rectangle, should solve any possible problems
         * with fonts that overflow their character cells.
         */
        laststart = 0;
        dirtyrect = false;
        for (j = 0; j < term->cols; j++) {
            if (term->disptext[i]->chars[j].attr & DATTR_STARTRUN) {
                laststart = j;
                dirtyrect = false;
            }

            if (term->disptext[i]->chars[j].chr != newline[j].chr ||
                (term->disptext[i]->chars[j].attr &~ DATTR_MASK)
                != newline[j].attr) {
                int k;

                if (!dirtyrect) {
                    for (k = laststart; k < j; k++)
                        term->disptext[i]->chars[k].attr |= ATTR_INVALID;

                    dirtyrect = true;
                }
            }

            if (dirtyrect)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        }

        /*
         * Finally, loop once more and actually do the drawing.
         */
        dirty_run = dirty_line = (ldata->lattr !=
                                  term->disptext[i]->lattr);
        term->disptext[i]->lattr = ldata->lattr;

        tc = term->erase_char.truecolour;
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            bool break_run, do_copy;
            termchar *d = lchars + j;

            tattr = newline[j].attr;
            tchar = newline[j].chr;

            if ((term->disptext[i]->chars[j].attr ^ tattr) & ATTR_WIDE)
                dirty_line = true;

            break_run = ((tattr ^ attr) & term->attr_mask) != 0;

            if (!truecolour_equal(newline[j].truecolour, tc))
                break_run = true;

#ifdef USES_VTLINE_HACK
            /* Special hack for VT100 Linedraw glyphs */
            if ((tchar >= 0x23BA && tchar <= 0x23BD) ||
                (j > 0 && (newline[j-1].chr >= 0x23BA &&
                           newline[j-1].chr <= 0x23BD)))
                break_run = true;
#endif

            /*
             * Separate out sequences of characters that have the
             * same CSET, if that CSET is a magic one.
             */
            if (CSET_OF(tchar) != cset)
                break_run = true;

            /*
             * Break on both sides of any combined-character cell.
             */
            if (d->cc_next != 0 ||
                (j > 0 && d[-1].cc_next != 0))
                break_run = true;

            /*
             * Break on both sides of a trust sigil.
             */
            if (d->chr == TRUST_SIGIL_CHAR ||
                (j >= 2 && d[-1].chr == UCSWIDE &&
                 d[-2].chr == TRUST_SIGIL_CHAR))
                break_run = true;

            if (!term->ucsdata->dbcs_screenfont && !dirty_line) {
                if (term->disptext[i]->chars[j].chr == tchar &&
                    (term->disptext[i]->chars[j].attr &~ DATTR_MASK)==tattr &&
                    truecolour_equal(
                        term->disptext[i]->chars[j].truecolour, tc))
                    break_run = true;
                else if (!dirty_run && ccount == 1)
                    break_run = true;
            }

            if (break_run) {
                if ((dirty_run || last_run_dirty) && ccount > 0)
                    do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);
                start = j;
                ccount = 0;
                attr = tattr;
                tc = newline[j].truecolour;
                cset = CSET_OF(tchar);
                if (term->ucsdata->dbcs_screenfont)
                    last_run_dirty = dirty_run;
                dirty_run = dirty_line;
            }

            do_copy = false;
            if (!termchars_equal_override(&term->disptext[i]->chars[j],
                                          d, tchar, tattr)) {
                do_copy = true;
                dirty_run = true;
            }

            sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
            if (tchar > 0x10000 && tchar < 0x110000) {
                ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(tchar);
                ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(tchar);
            } else
#endif /* PLATFORM_IS_UTF16 */
            ch[ccount++] = (wchar_t) tchar;

            if (d->cc_next) {
                termchar *dd = d;

                while (dd->cc_next) {
                    unsigned long schar;

                    dd += dd->cc_next;

                    schar = dd->chr;
                    switch (schar & CSET_MASK) {
                      case CSET_ASCII:
                        schar = term->ucsdata->unitab_line[schar & 0xFF];
                        break;
                      case CSET_LINEDRW:
                        schar = term->ucsdata->unitab_xterm[schar & 0xFF];
                        break;
                      case CSET_SCOACS:
                        schar = term->ucsdata->unitab_scoacs[schar&0xFF];
                        break;
                    }

                    sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
                    if (schar > 0x10000 && schar < 0x110000) {
                        ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(schar);
                        ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(schar);
                    } else
#endif /* PLATFORM_IS_UTF16 */
                    ch[ccount++] = (wchar_t) schar;
                }

                attr |= TATTR_COMBINING;
            }

            if (do_copy) {
                copy_termchar(term->disptext[i], j, d);
                term->disptext[i]->chars[j].chr = tchar;
                term->disptext[i]->chars[j].attr = tattr;
                term->disptext[i]->chars[j].truecolour = tc;
                if (start == j)
                    term->disptext[i]->chars[j].attr |= DATTR_STARTRUN;
            }

            /* If it's a wide char step along to the next one. */
            if (tattr & ATTR_WIDE) {
                if (++j < term->cols) {
                    d++;
                    /*
                     * By construction above, the cursor should not
                     * be on the right-hand half of this character.
                     * Ever.
                     */
                    assert(!(i == our_curs_y && j == our_curs_x));
                    if (!termchars_equal(&term->disptext[i]->chars[j], d))
                        dirty_run = true;
                    copy_termchar(term->disptext[i], j, d);
                }
            }
        }
        if (dirty_run && ccount > 0)
            do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);

        unlineptr(ldata);
    }

    sfree(newline);
    sfree(ch);
}